

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O3

AspifTextOutput * __thiscall
Potassco::AspifTextOutput::push(AspifTextOutput *this,WeightLitSpan *wlits)

{
  WeightLit_t *pWVar1;
  size_t sVar2;
  pointer puVar3;
  iterator iVar4;
  Data *pDVar5;
  WeightLit_t *pWVar6;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  pDVar5 = this->data_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&pDVar5->directives,
             ((long)(pDVar5->directives).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pDVar5->directives).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) + wlits->size * 2);
  pDVar5 = this->data_;
  sVar2 = wlits->size;
  local_2c = (uint)sVar2;
  iVar4._M_current =
       (pDVar5->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (pDVar5->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pDVar5->directives,iVar4,&local_2c);
    sVar2 = wlits->size;
  }
  else {
    *iVar4._M_current = local_2c;
    (pDVar5->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  if (sVar2 != 0) {
    pWVar6 = wlits->first;
    pWVar1 = pWVar6 + sVar2;
    do {
      pDVar5 = this->data_;
      local_30 = pWVar6->lit;
      iVar4._M_current =
           (pDVar5->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      puVar3 = (pDVar5->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (iVar4._M_current == puVar3) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&pDVar5->directives,iVar4,&local_30);
        pDVar5 = this->data_;
        iVar4._M_current =
             (pDVar5->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        puVar3 = (pDVar5->directives).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar4._M_current = local_30;
        iVar4._M_current = iVar4._M_current + 1;
        (pDVar5->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar4._M_current;
      }
      local_34 = pWVar6->weight;
      if (iVar4._M_current == puVar3) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&pDVar5->directives,iVar4,&local_34);
      }
      else {
        *iVar4._M_current = local_34;
        (pDVar5->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      pWVar6 = pWVar6 + 1;
    } while (pWVar6 != pWVar1);
  }
  return this;
}

Assistant:

AspifTextOutput& AspifTextOutput::push(const WeightLitSpan& wlits) {
	data_->directives.reserve(data_->directives.size() + (2*size(wlits)));
	data_->directives.push_back(static_cast<uint32_t>(size(wlits)));
	for (WeightLitSpan::iterator it = begin(wlits), end = Potassco::end(wlits); it != end; ++it) {
		data_->directives.push_back(static_cast<uint32_t>(lit(*it)));
		data_->directives.push_back(static_cast<uint32_t>(weight(*it)));
	}
	return *this;
}